

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::AllHigherDimensionSides
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,int side,
          int targetdimension,TPZStack<TPZGeoElSide,_10> *elsides)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  TPZStack<int,_10> highsides;
  TPZGeoElSide local_90;
  TPZManVector<int,_10> local_78;
  
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
  pztopology::TPZTriangle::HigherDimensionSides(side,(TPZStack<int,_10> *)&local_78);
  uVar3 = 0;
  uVar2 = (ulong)(uint)local_78.super_TPZVec<int>.fNElements;
  if ((int)(uint)local_78.super_TPZVec<int>.fNElements < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x208))
                      (this,local_78.super_TPZVec<int>.fStore[uVar3]);
    if (iVar1 == targetdimension) {
      local_90.fSide = local_78.super_TPZVec<int>.fStore[uVar3];
      local_90.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      local_90.fGeoEl = &this->super_TPZGeoEl;
      TPZStack<TPZGeoElSide,_10>::Push(elsides,&local_90);
    }
  }
  TPZManVector<int,_10>::~TPZManVector(&local_78);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::AllHigherDimensionSides(int side,int targetdimension,TPZStack<TPZGeoElSide> &elsides){
	TPZStack<int> highsides;
	TGeo::HigherDimensionSides(side,highsides);
	int i,size = highsides.NElements();
	for(i=0;i<size;i++) {
		if(SideDimension(highsides[i]) == targetdimension) {
			elsides.Push(TPZGeoElSide(this,highsides[i]));
		}
	}
}